

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::MakeDollarName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string *psVar4;
  string *extraout_RAX;
  string *extraout_RAX_00;
  ulong uVar5;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"$","",name._M_str);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,name._M_len,this + name._M_len);
  uVar5 = 0xf;
  if (local_50 != local_40) {
    uVar5 = local_40[0];
  }
  if (uVar5 < (ulong)(local_68 + local_48)) {
    uVar5 = 0xf;
    if (local_70 != local_60) {
      uVar5 = local_60[0];
    }
    if ((ulong)(local_68 + local_48) <= uVar5) {
      psVar4 = (string *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_0014f166;
    }
  }
  psVar4 = (string *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
LAB_0014f166:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  paVar1 = &psVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&psVar4->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = psVar4->_M_string_length;
  (psVar4->_M_dataplus)._M_p = (pointer)paVar1;
  psVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
    psVar4 = extraout_RAX;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
    psVar4 = extraout_RAX_00;
  }
  return psVar4;
}

Assistant:

static std::string MakeDollarName(std::string_view name) {
  return std::string("$") + std::string(name);
}